

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

void drwav__ieee_to_f32(float *pOut,drwav_uint8 *pIn,size_t sampleCount,uint bytesPerSample)

{
  int in_ECX;
  ulong in_RDX;
  double *in_RSI;
  float *in_RDI;
  uint i;
  uint local_20;
  float *local_8;
  
  if (in_ECX == 4) {
    local_8 = in_RDI;
    for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
      *local_8 = *(float *)((long)in_RSI + (ulong)local_20 * 4);
      local_8 = local_8 + 1;
    }
  }
  else if (in_ECX == 8) {
    drwav_f64_to_f32(in_RDI,in_RSI,in_RDX);
  }
  else {
    memset(in_RDI,0,in_RDX << 2);
  }
  return;
}

Assistant:

static void drwav__ieee_to_f32(float* pOut, const drwav_uint8* pIn, size_t sampleCount, unsigned int bytesPerSample)
{
    if (bytesPerSample == 4) {
        unsigned int i;
        for (i = 0; i < sampleCount; ++i) {
            *pOut++ = ((const float*)pIn)[i];
        }
        return;
    } else if (bytesPerSample == 8) {
        drwav_f64_to_f32(pOut, (const double*)pIn, sampleCount);
        return;
    } else {
        /* Only supporting 32- and 64-bit float. Output silence in all other cases. Contributions welcome for 16-bit float. */
        DRWAV_ZERO_MEMORY(pOut, sampleCount * sizeof(*pOut));
        return;
    }
}